

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortEps.h
# Opt level: O2

void __thiscall SortEps::store(SortEps *this,uint32_t dst,uint32_t src)

{
  if (dst != src) {
    this->eps[dst] = this->eps[src];
    this->ok[dst] = this->ok[src];
    this->lp[dst] = this->lp[src];
    this->od[dst] = this->od[src];
    this->misd[dst] = this->misd[src];
  }
  return;
}

Assistant:

inline void store(uint32_t dst, uint32_t src) {
    if (dst == src) return;
    eps[dst] = eps[src];
    ok[dst] = ok[src];
    lp[dst] = lp[src];
    od[dst] = od[src];
    misd[dst] = misd[src];
    masd[dst] = masd[dst];
  }